

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall
fasttext::DenseMatrix::averageRowsToVector
          (DenseMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  lVar3 = (this->super_Matrix).n_;
  if (lVar3 < 0x40) {
    if (lVar3 == 0x10) {
      averageRowsFast<16u>(x,rows,this);
      return;
    }
    if (lVar3 == 0x20) {
      averageRowsFast<32u>(x,rows,this);
      return;
    }
  }
  else {
    if (lVar3 == 0x40) {
      averageRowsFast<64u>(x,rows,this);
      return;
    }
    if (lVar3 == 0x100) {
      averageRowsFast<256u>(x,rows,this);
      return;
    }
    if (lVar3 == 0x200) {
      averageRowsFast<512u>(x,rows,this);
      return;
    }
  }
  Vector::zero(x);
  puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar2 = puVar1;
  if (puVar1 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
    do {
      (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar2);
      puVar2 = puVar2 + 1;
    } while (puVar2 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish);
    puVar1 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
  }
  lVar3 = (long)puVar2 - (long)puVar1 >> 2;
  auVar4._8_4_ = (int)((long)puVar2 - (long)puVar1 >> 0x22);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  Vector::mul(x,(float)(1.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))));
  return;
}

Assistant:

void DenseMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
#if defined(__AVX512F__) || defined(__AVX__) || defined(__SSE__)
  switch (cols()) {
    case 512:
      // Maximum number that can fit all in registers on AVX512F.
      averageRowsFast<512>(x, rows, *this);
      return;
    case 256:
      averageRowsFast<256>(x, rows, *this);
      return;
    case 64:
      averageRowsFast<64>(x, rows, *this);
      return;
    case 32:
      averageRowsFast<32>(x, rows, *this);
      return;
    case 16:
      averageRowsFast<16>(x, rows, *this);
      return;
  }
#endif
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}